

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int uv_sem_init(uv_sem_t *sem,uint value)

{
  uint value_local;
  uv_sem_t *sem_local;
  
  uv_once(&glibc_version_check_once,glibc_version_check);
  if (platform_needs_custom_semaphore == 0) {
    sem_local._4_4_ = uv__sem_init(sem,value);
  }
  else {
    sem_local._4_4_ = uv__custom_sem_init(sem,value);
  }
  return sem_local._4_4_;
}

Assistant:

int uv_sem_init(uv_sem_t* sem, unsigned int value) {
#if defined(__GLIBC__) && !defined(__UCLIBC__)
  uv_once(&glibc_version_check_once, glibc_version_check);
#endif

  if (platform_needs_custom_semaphore)
    return uv__custom_sem_init(sem, value);
  else
    return uv__sem_init(sem, value);
}